

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Quaternion pbrt::Slerp(Float t,Quaternion *q1,Quaternion *q2)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar10 [56];
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar18 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  Quaternion QVar19;
  Float sinThetaOverTheta;
  Float theta;
  undefined8 in_stack_ffffffffffffff78;
  Float f;
  Quaternion *q;
  Quaternion *in_stack_ffffffffffffff80;
  Quaternion *this;
  Quaternion *in_stack_ffffffffffffff88;
  undefined1 auVar3 [64];
  undefined1 auVar11 [64];
  
  f = (Float)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  AngleBetween(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  SinXOverX(8.21799e-39);
  auVar18 = (undefined1  [56])0x0;
  auVar10 = (undefined1  [56])0x0;
  QVar19 = Quaternion::operator*(in_stack_ffffffffffffff80,f);
  auVar11._0_8_ = QVar19._8_8_;
  auVar11._8_56_ = auVar18;
  auVar3._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar10;
  vmovlpd_avx(auVar3._0_16_);
  vmovlpd_avx(auVar11._0_16_);
  auVar18 = (undefined1  [56])0x0;
  SinXOverX(8.218121e-39);
  auVar10 = extraout_var;
  QVar19 = Quaternion::operator*(in_stack_ffffffffffffff80,f);
  auVar12._0_8_ = QVar19._8_8_;
  auVar12._8_56_ = auVar18;
  auVar4._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar10;
  vmovlpd_avx(auVar4._0_16_);
  vmovlpd_avx(auVar12._0_16_);
  auVar10 = (undefined1  [56])0x0;
  QVar19 = Quaternion::operator/(in_stack_ffffffffffffff80,f);
  auVar13._0_8_ = QVar19._8_8_;
  auVar13._8_56_ = auVar18;
  auVar5._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  vmovlpd_avx(auVar5._0_16_);
  vmovlpd_avx(auVar13._0_16_);
  auVar10 = (undefined1  [56])0x0;
  QVar19 = Quaternion::operator*(in_stack_ffffffffffffff80,f);
  auVar14._0_8_ = QVar19._8_8_;
  auVar14._8_56_ = auVar18;
  auVar6._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar10;
  vmovlpd_avx(auVar6._0_16_);
  q = (Quaternion *)vmovlpd_avx(auVar14._0_16_);
  auVar18 = (undefined1  [56])0x0;
  SinXOverX(8.218268e-39);
  auVar10 = extraout_var_00;
  QVar19 = Quaternion::operator*(in_stack_ffffffffffffff80,(Float)((ulong)q >> 0x20));
  auVar15._0_8_ = QVar19._8_8_;
  auVar15._8_56_ = auVar18;
  auVar7._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar10;
  this = (Quaternion *)vmovlpd_avx(auVar7._0_16_);
  vmovlpd_avx(auVar15._0_16_);
  auVar10 = (undefined1  [56])0x0;
  QVar19 = Quaternion::operator/(this,(Float)((ulong)q >> 0x20));
  auVar16._0_8_ = QVar19._8_8_;
  auVar16._8_56_ = auVar18;
  auVar8._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar10;
  vmovlpd_avx(auVar8._0_16_);
  vmovlpd_avx(auVar16._0_16_);
  QVar19 = Quaternion::operator+(this,q);
  auVar17._0_8_ = QVar19._8_8_;
  auVar17._8_56_ = auVar18;
  auVar9._0_8_ = QVar19.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  uVar1 = vmovlpd_avx(auVar9._0_16_);
  uVar2 = vmovlpd_avx(auVar17._0_16_);
  QVar19.v.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)uVar2;
  QVar19.w = (Float)(int)((ulong)uVar2 >> 0x20);
  QVar19.v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  QVar19.v.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  return QVar19;
}

Assistant:

PBRT_CPU_GPU
inline Quaternion Slerp(Float t, const Quaternion &q1, const Quaternion &q2) {
    Float theta = AngleBetween(q1, q2);
    Float sinThetaOverTheta = SinXOverX(theta);
    return q1 * (1 - t) * SinXOverX((1 - t) * theta) / sinThetaOverTheta +
           q2 * t * SinXOverX(t * theta) / sinThetaOverTheta;
}